

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysqlhs_connection.cpp
# Opt level: O0

void __thiscall
mysqlhs::connection::split
          (connection *this,string *s,char c,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *v)

{
  bool bVar1;
  istream *__x;
  char in_DL;
  string item;
  stringstream ss;
  stringstream *this_00;
  string local_1d8 [48];
  stringstream local_1a8 [407];
  char local_11;
  
  this_00 = local_1a8;
  local_11 = in_DL;
  std::__cxx11::stringstream::stringstream(this_00);
  std::__cxx11::stringstream::str((string *)this_00);
  std::__cxx11::string::string(local_1d8);
  while( true ) {
    __x = std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_1a8,local_1d8,local_11);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(__x + *(long *)(*(long *)__x + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,(value_type *)__x);
  }
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void connection::split(const std::string& s, char c, std::vector<std::string>& v)
	{
		std::stringstream ss;
		ss.str(s);

		std::string item;
		while (std::getline(ss, item, c))
		{
			v.push_back(item);
		}
	}